

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

void resetModelStatusAndHighsInfo(HighsModelStatus *model_status,HighsInfo *highs_info)

{
  *model_status = kMin;
  (highs_info->super_HighsInfoStruct).objective_function_value = 0.0;
  (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = -1;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = INFINITY;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = -1;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = INFINITY;
  return;
}

Assistant:

void resetModelStatusAndHighsInfo(HighsModelStatus& model_status,
                                  HighsInfo& highs_info) {
  model_status = HighsModelStatus::kNotset;
  highs_info.objective_function_value = 0;
  highs_info.primal_solution_status = kSolutionStatusNone;
  highs_info.dual_solution_status = kSolutionStatusNone;
  highs_info.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
  highs_info.max_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  highs_info.sum_primal_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  highs_info.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
  highs_info.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
  highs_info.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
}